

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_lib.h
# Opt level: O2

void __thiscall
ze_lib::context_t::debug_trace_message(context_t *this,string *message,string *result)

{
  ostream *poVar1;
  string debugTracePrefix;
  allocator local_39;
  string local_38 [32];
  
  if (this->debugTraceEnabled == true) {
    std::__cxx11::string::string(local_38,"ZE_LOADER_DEBUG_TRACE:",&local_39);
    poVar1 = std::operator<<((ostream *)&std::cerr,local_38);
    poVar1 = std::operator<<(poVar1,(string *)message);
    poVar1 = std::operator<<(poVar1,(string *)result);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

__zedlllocal void debug_trace_message(std::string message, std::string result) {
        if (debugTraceEnabled){
            std::string debugTracePrefix = "ZE_LOADER_DEBUG_TRACE:";
            std::cerr << debugTracePrefix << message << result << std::endl;
        }
    }